

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

void despot::AEMS::Backup(VNode *vnode)

{
  int iVar1;
  void *pvVar2;
  QNode *qnode;
  log_ostream *plVar3;
  ostream *poVar4;
  double dVar5;
  QNode *parentq;
  VNode *pVStack_10;
  int iter;
  VNode *vnode_local;
  
  parentq._4_4_ = 0;
  iVar1 = logging::level();
  pVStack_10 = vnode;
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar3 = logging::stream(4);
    poVar4 = std::operator<<(&plVar3->super_ostream,"- Backup ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,vnode);
    poVar4 = std::operator<<(poVar4," at depth ");
    iVar1 = VNode::depth(vnode);
    pvVar2 = (void *)std::ostream::operator<<(poVar4,iVar1);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  while( true ) {
    iVar1 = logging::level();
    if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
      plVar3 = logging::stream(4);
      poVar4 = std::operator<<(&plVar3->super_ostream," Iter ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,parentq._4_4_);
      poVar4 = std::operator<<(poVar4," ");
      pvVar2 = (void *)std::ostream::operator<<(poVar4,pVStack_10);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      parentq._4_4_ = parentq._4_4_ + 1;
    }
    Update(pVStack_10);
    iVar1 = logging::level();
    if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
      plVar3 = logging::stream(4);
      poVar4 = std::operator<<(&plVar3->super_ostream," Updated vnode ");
      pvVar2 = (void *)std::ostream::operator<<(poVar4,pVStack_10);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    }
    qnode = VNode::parent(pVStack_10);
    if (qnode == (QNode *)0x0) break;
    Update(qnode);
    iVar1 = logging::level();
    if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
      plVar3 = logging::stream(4);
      poVar4 = std::operator<<(&plVar3->super_ostream," Updated Q-node to (");
      dVar5 = QNode::lower_bound(qnode);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
      poVar4 = std::operator<<(poVar4,", ");
      dVar5 = QNode::upper_bound(qnode);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    pVStack_10 = QNode::parent(qnode);
  }
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 3 < iVar1)) {
    plVar3 = logging::stream(4);
    poVar4 = std::operator<<(&plVar3->super_ostream,"* Backup complete!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void AEMS::Backup(VNode* vnode) {
	int iter = 0;
	logd << "- Backup " << vnode << " at depth " << vnode->depth() << endl;
	while (true) {
		logd << " Iter " << (iter++) << " " << vnode << endl;

		Update(vnode);
		logd << " Updated vnode " << vnode << endl;

		QNode* parentq = vnode->parent();
		if (parentq == NULL)
			break;

		Update(parentq);
		logd << " Updated Q-node to (" << parentq->lower_bound() << ", "
			<< parentq->upper_bound() << ")" << endl;

		vnode = parentq->parent();
	}
	logd << "* Backup complete!" << endl;
}